

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O3

void test_dry(vector<float,_std::allocator<float>_> *probs,
             vector<int,_std::allocator<int>_> *last_tokens,
             vector<float,_std::allocator<float>_> *expected_probs,float dry_multiplier,
             float dry_base,int dry_allowed_length,int dry_penalty_last_n,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *seq_breakers)

{
  undefined8 uVar1;
  pointer piVar2;
  ulong uVar3;
  sampler_tester tester;
  sampler_tester local_70;
  
  if ((long)(probs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(probs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start ==
      (long)(expected_probs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(expected_probs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    sampler_tester::sampler_tester(&local_70,probs,expected_probs);
    uVar1 = llama_sampler_init_dry_testing
                      (0x400,dry_multiplier,1.1,dry_allowed_length,dry_penalty_last_n,
                       (vector *)seq_breakers);
    piVar2 = (last_tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((last_tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish != piVar2) {
      uVar3 = 0;
      do {
        llama_sampler_accept(uVar1,piVar2[uVar3]);
        uVar3 = uVar3 + 1;
        piVar2 = (last_tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(last_tokens->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2))
      ;
    }
    printf("%s:%d (%s)\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
           ,0xb1,"test_dry");
    dump(&local_70.cur_p);
    puts("-");
    llama_sampler_apply(uVar1,&local_70);
    llama_sampler_free(uVar1);
    uVar1 = llama_sampler_init_dist(0);
    llama_sampler_apply(uVar1,&local_70);
    llama_sampler_free(uVar1);
    printf("%s:%d (%s)\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
           ,0xb4,"test_dry");
    dump(&local_70.cur_p);
    puts("-");
    sampler_tester::check(&local_70);
    if (local_70.cur.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.cur.
                      super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.cur.
                            super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.cur.
                            super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_70.probs_expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.probs_expected.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.probs_expected.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.probs_expected.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  uVar1 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
                     ,0xa7,"GGML_ASSERT(%s) failed","probs.size() == expected_probs.size()");
  sampler_tester::~sampler_tester(&local_70);
  _Unwind_Resume(uVar1);
}

Assistant:

static void test_dry(
    const std::vector<float> & probs, const std::vector<llama_token> & last_tokens,
    const std::vector<float> & expected_probs, float dry_multiplier, float dry_base,
    int dry_allowed_length, int dry_penalty_last_n,
    const std::vector<std::vector<llama_token>> & seq_breakers
) {
    GGML_ASSERT(probs.size() == expected_probs.size());

    sampler_tester tester(probs, expected_probs);

    auto * sampler = llama_sampler_init_dry_testing(1024, dry_multiplier, dry_base, dry_allowed_length, dry_penalty_last_n, seq_breakers);

    for (size_t i = 0; i < last_tokens.size(); i++) {
        llama_sampler_accept(sampler, last_tokens[i]);
    }

    DUMP(&tester.cur_p);
    tester.apply(sampler);
    tester.apply(llama_sampler_init_dist(0));
    DUMP(&tester.cur_p);
    tester.check();
}